

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateVkImpl::PipelineStateVkImpl
          (PipelineStateVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDeviceVk,
          RayTracingPipelineStateCreateInfo *CreateInfo)

{
  PipelineStateBase<Diligent::EngineVkImplTraits>::
  PipelineStateBase<Diligent::RayTracingPipelineStateCreateInfo>
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,pRefCounters,pDeviceVk,
             CreateInfo,false);
  (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
  .super_ObjectBase<Diligent::IPipelineStateVk>.super_RefCountedObject<Diligent::IPipelineStateVk>.
  super_IPipelineStateVk.super_IPipelineState.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00aebd78;
  (this->m_Pipeline).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_Pipeline).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Pipeline).m_VkObject = (VkPipeline_T *)0x0;
  PipelineLayoutVk::PipelineLayoutVk(&this->m_PipelineLayout);
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::SPIRVShaderResources>,_std::allocator<std::shared_ptr<const_Diligent::SPIRVShaderResources>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::SPIRVShaderResources>,_std::allocator<std::shared_ptr<const_Diligent::SPIRVShaderResources>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::SPIRVShaderResources>,_std::allocator<std::shared_ptr<const_Diligent::SPIRVShaderResources>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PipelineStateBase<Diligent::EngineVkImplTraits>::
  Construct<Diligent::ShaderVkImpl,Diligent::RayTracingPipelineStateCreateInfo>
            (&this->super_PipelineStateBase<Diligent::EngineVkImplTraits>,CreateInfo);
  return;
}

Assistant:

PipelineStateVkImpl::PipelineStateVkImpl(IReferenceCounters* pRefCounters, RenderDeviceVkImpl* pDeviceVk, const RayTracingPipelineStateCreateInfo& CreateInfo) :
    TPipelineStateBase{pRefCounters, pDeviceVk, CreateInfo}
{
    Construct<ShaderVkImpl>(CreateInfo);
}